

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O1

int bucket_insert(bucket b,void *key,void *value)

{
  size_t sVar1;
  pair ppVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  if ((key == (void *)0x0 || b == (bucket)0x0) || value == (void *)0x0) {
    pcVar5 = "Invalid bucket insert parameters";
    uVar4 = 0xf2;
LAB_00103c06:
    log_write_impl_va("metacall",uVar4,"bucket_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,3,pcVar5);
    iVar3 = 1;
  }
  else {
    if (b->pairs == (pair)0x0) {
      iVar3 = bucket_alloc_pairs(b,4);
      if (iVar3 != 0) {
        pcVar5 = "Invalid bucket insertion pairs allocation";
        uVar4 = 0xf8;
        goto LAB_00103c06;
      }
    }
    if (b->capacity <= b->count + 1) {
      iVar3 = bucket_realloc_pairs(b,b->capacity * 2);
      if (iVar3 != 0) {
        pcVar5 = "Invalid bucket insertion pairs reallocation";
        uVar4 = 0x100;
        goto LAB_00103c06;
      }
    }
    sVar1 = b->count;
    ppVar2 = b->pairs;
    ppVar2[sVar1].key = key;
    ppVar2[sVar1].value = value;
    b->count = sVar1 + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int bucket_insert(bucket b, void *key, void *value)
{
	pair p;

	if (b == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insert parameters");
		return 1;
	}

	if (b->pairs == NULL && bucket_alloc_pairs(b, BUCKET_PAIRS_DEFAULT) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs allocation");
		return 1;
	}

	if ((b->count + 1) >= b->capacity)
	{
		if (bucket_realloc_pairs(b, b->capacity << 1) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs reallocation");
			return 1;
		}
	}

	p = &b->pairs[b->count];

	p->key = key;
	p->value = value;

	++b->count;

	return 0;
}